

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O3

void Test25(void)

{
  size_type *psVar1;
  byte bVar2;
  CMOptions Options;
  CMReturn In;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  string result;
  string in;
  CMReturn res;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  ConfusableMatcher matcher;
  string local_2270;
  _CM_RETURN_STATUS local_224c;
  undefined1 *local_2248;
  long local_2240;
  undefined1 local_2238;
  undefined7 uStack_2237;
  ulong *local_2228;
  long local_2220;
  ulong Size;
  undefined4 in_stack_ffffffffffffddf0;
  undefined4 in_stack_ffffffffffffddf4;
  long *local_2208;
  ulong local_2200;
  long local_21f8 [2];
  long *local_21e8;
  long local_21e0;
  long local_21d8;
  undefined8 in_stack_ffffffffffffde30;
  long *plVar7;
  undefined8 in_stack_ffffffffffffde40;
  long local_21b8 [2];
  CMReturn local_21a8;
  undefined4 local_2188;
  undefined4 uStack_2184;
  long lStack_2180;
  undefined4 local_2178;
  undefined4 uStack_2174;
  undefined8 uStack_2170;
  undefined8 local_2168;
  void *pvStack_2160;
  string local_2158;
  string local_2138;
  string local_2118;
  string local_20f8;
  undefined1 local_20d8;
  undefined7 uStack_20d7;
  undefined1 uStack_20d0;
  undefined7 uStack_20cf;
  undefined1 uStack_20c8;
  undefined7 uStack_20c7;
  undefined8 uStack_20c0;
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20a8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2090;
  undefined8 local_2078;
  void *pvStack_2070;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2068;
  ConfusableMatcher local_2030;
  
  GetDefaultMap_abi_cxx11_();
  local_21e8 = &local_21d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_21e8,
             "ASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASB"
             ,"");
  local_2078 = 0;
  pvStack_2070 = (void *)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_20a8,&local_2090);
  local_2068._M_buckets = &local_2068._M_single_bucket;
  local_2068._M_bucket_count = 1;
  local_2068._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2068._M_element_count = 0;
  local_2068._M_rehash_policy._M_max_load_factor = 1.0;
  local_2068._M_rehash_policy._4_4_ = 0;
  local_2068._M_rehash_policy._M_next_resize = 0;
  local_2068._M_single_bucket = (__node_base_ptr)0x0;
  ConfusableMatcher::ConfusableMatcher
            (&local_2030,&local_20a8,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2068,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2068);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_20a8);
  local_20f8._M_dataplus._M_p = (pointer)&local_20f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_20f8,local_21e8,local_21e0 + (long)local_21e8);
  local_2118._M_dataplus._M_p = (pointer)&local_2118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2118,"ASB","");
  local_20d8 = 1;
  uStack_20d7 = 0;
  uStack_20d0 = 0;
  uStack_20cf = 0;
  uStack_20c8 = 0;
  uStack_20c7 = 0;
  uStack_20c0 = 1;
  local_20b8 = 0;
  uStack_20b0 = 0;
  ConfusableMatcher::IndexOf
            (&local_21a8,&local_2030,&local_20f8,&local_2118,
             (CMOptions)ZEXT3248(CONCAT824(1,CONCAT816(0,ZEXT816(1)))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2118._M_dataplus._M_p != &local_2118.field_2) {
    operator_delete(local_2118._M_dataplus._M_p,local_2118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_20f8._M_dataplus._M_p != &local_20f8.field_2) {
    operator_delete(local_20f8._M_dataplus._M_p,local_20f8.field_2._M_allocated_capacity + 1);
  }
  local_224c = TIMEOUT;
  plVar7 = local_21b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffde38,"Test25","");
  plVar3 = (long *)std::__cxx11::string::append(&stack0xffffffffffffde38);
  local_2228 = (ulong *)&stack0xffffffffffffdde8;
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    Size = *puVar5;
    in_stack_ffffffffffffddf0 = (undefined4)plVar3[3];
    in_stack_ffffffffffffddf4 = *(undefined4 *)((long)plVar3 + 0x1c);
  }
  else {
    Size = *puVar5;
    local_2228 = (ulong *)*plVar3;
  }
  local_2220 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_2208 = local_21f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2208,"TIMEOUT == res.Status","");
  local_2248 = &local_2238;
  local_2240 = 0;
  local_2238 = 0;
  std::__cxx11::string::reserve((ulong)&local_2248);
  if (local_2200 != 0) {
    uVar6 = 0;
    do {
      bVar2 = *(byte *)((long)local_2208 + uVar6);
      if (bVar2 < 0xd) {
        if ((bVar2 != 9) && (bVar2 != 10)) goto LAB_0012230f;
LAB_0012231f:
        std::__cxx11::string::append((char *)&local_2248);
      }
      else {
        if ((bVar2 == 0xd) || (bVar2 == 0x5c)) goto LAB_0012231f;
LAB_0012230f:
        std::__cxx11::string::push_back((char)&local_2248);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_2200);
  }
  uVar6 = 0xf;
  if (local_2228 != (ulong *)&stack0xffffffffffffdde8) {
    uVar6 = Size;
  }
  if (uVar6 < (ulong)(local_2240 + local_2220)) {
    uVar6 = 0xf;
    if (local_2248 != &local_2238) {
      uVar6 = CONCAT71(uStack_2237,local_2238);
    }
    if ((ulong)(local_2240 + local_2220) <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2248,0,(char *)0x0,(ulong)local_2228);
      goto LAB_001223ad;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2228,(ulong)local_2248);
LAB_001223ad:
  local_2270._M_dataplus._M_p = (pointer)&local_2270.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2270.field_2._M_allocated_capacity = *psVar1;
    local_2270.field_2._8_8_ = puVar4[3];
  }
  else {
    local_2270.field_2._M_allocated_capacity = *psVar1;
    local_2270._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_2270._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  cute::assert_equal<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
            (&local_224c,&local_21a8.Status,&local_2270,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x28f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2270._M_dataplus._M_p != &local_2270.field_2) {
    operator_delete(local_2270._M_dataplus._M_p,local_2270.field_2._M_allocated_capacity + 1);
  }
  if (local_2248 != &local_2238) {
    operator_delete(local_2248,CONCAT71(uStack_2237,local_2238) + 1);
  }
  if (local_2208 != local_21f8) {
    operator_delete(local_2208,local_21f8[0] + 1);
  }
  if (local_2228 != (ulong *)&stack0xffffffffffffdde8) {
    operator_delete(local_2228,Size + 1);
  }
  if (plVar7 != local_21b8) {
    operator_delete(plVar7,local_21b8[0] + 1);
  }
  local_2138._M_dataplus._M_p = (pointer)&local_2138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2138,local_21e8,(long)local_21e8 + local_21e0);
  local_2158._M_dataplus._M_p = (pointer)&local_2158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2158,"ASB","");
  lStack_2180 = local_21e0 + -1;
  uStack_2184 = 0;
  local_2188 = 1;
  uStack_2174 = 0;
  local_2178 = 1;
  uStack_2170 = 1;
  local_2168 = local_2078;
  pvStack_2160 = pvStack_2070;
  Options.StartIndex = lStack_2180;
  Options._0_8_ = 1;
  Options._16_4_ = 1;
  Options._20_4_ = 0;
  Options.TimeoutNs = 1;
  Options._32_8_ = local_2078;
  Options.ContainsPosPointers = pvStack_2070;
  ConfusableMatcher::IndexOf((CMReturn *)&local_2270,&local_2030,&local_2138,&local_2158,Options);
  local_21a8._16_8_ = local_2270.field_2._M_allocated_capacity;
  local_21a8.Start = (uint64_t)local_2270._M_dataplus._M_p;
  local_21a8.Size = local_2270._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2158._M_dataplus._M_p != &local_2158.field_2) {
    operator_delete(local_2158._M_dataplus._M_p,local_2158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2138._M_dataplus._M_p != &local_2138.field_2) {
    operator_delete(local_2138._M_dataplus._M_p,local_2138.field_2._M_allocated_capacity + 1);
  }
  In.Size = (uint64_t)plVar7;
  In.Start = in_stack_ffffffffffffde30;
  In._16_8_ = in_stack_ffffffffffffde40;
  AssertMatch(In,CONCAT44(in_stack_ffffffffffffddf4,in_stack_ffffffffffffddf0),Size);
  ConfusableMatcher::~ConfusableMatcher(&local_2030);
  if (local_21e8 != &local_21d8) {
    operator_delete(local_21e8,local_21d8 + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2090);
  return;
}

Assistant:

void Test25()
{
	auto map = GetDefaultMap();

	std::string in = "ASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASASB";

	CMOptions opts = { };
	opts.MatchRepeating = true;
	opts.StartFromEnd = false;
	opts.TimeoutNs = 1;
	auto matcher = ConfusableMatcher(map, {});
	auto res = matcher.IndexOf(in, "ASB", opts);
	ASSERT_EQUAL(TIMEOUT, res.Status);

	opts.StartFromEnd = true;
	opts.StartIndex = in.size() - 1;
	res = matcher.IndexOf(in, "ASB", opts);
	AssertMatch(res, 92, 3);
}